

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetF0CandidateContour
               (ZeroCrossings *zero_crossings,double boundary_f0,double f0_floor,double f0_ceil,
               double *temporal_positions,int f0_length,double *f0_candidate)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  double *in_RCX;
  int in_EDX;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  int i_2;
  int i_1;
  double *interpolated_f0_set [4];
  int i;
  int local_70;
  int local_6c;
  double *local_68 [2];
  double *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  double *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar2 = CheckEvent(*(int *)(in_RDI + 0x10) + -2);
  iVar3 = CheckEvent(*(int *)(in_RDI + 0x28) + -2);
  iVar4 = CheckEvent(*(int *)(in_RDI + 0x40) + -2);
  iVar5 = CheckEvent(*(int *)(in_RDI + 0x58) + -2);
  if (iVar2 * iVar3 * iVar4 * iVar5 == 0) {
    for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
      in_RCX[iVar2] = 0.0;
    }
  }
  else {
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)in_EDX;
      uVar6 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pdVar7 = (double *)operator_new__(uVar6);
      local_68[local_6c] = pdVar7;
    }
    interp1((double *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,in_stack_ffffffffffffffc4,
            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    interp1((double *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,in_stack_ffffffffffffffc4,
            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    interp1((double *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,in_stack_ffffffffffffffc4,
            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    interp1((double *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,in_stack_ffffffffffffffc4,
            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    GetF0CandidateContourSub(local_68,in_EDX,in_XMM1_Qa,in_XMM2_Qa,in_XMM0_Qa,in_RCX);
    for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
      if (local_68[local_70] != (double *)0x0) {
        operator_delete__(local_68[local_70]);
      }
    }
  }
  return;
}

Assistant:

static void GetF0CandidateContour(const ZeroCrossings *zero_crossings,
    double boundary_f0, double f0_floor, double f0_ceil,
    const double *temporal_positions, int f0_length, double *f0_candidate) {
  if (0 == CheckEvent(zero_crossings->number_of_negatives - 2) *
      CheckEvent(zero_crossings->number_of_positives - 2) *
      CheckEvent(zero_crossings->number_of_peaks - 2) *
      CheckEvent(zero_crossings->number_of_dips - 2)) {
    for (int i = 0; i < f0_length; ++i) f0_candidate[i] = 0.0;
    return;
  }

  double *interpolated_f0_set[4];
  for (int i = 0; i < 4; ++i)
    interpolated_f0_set[i] = new double[f0_length];

  interp1(zero_crossings->negative_interval_locations,
      zero_crossings->negative_intervals,
      zero_crossings->number_of_negatives,
      temporal_positions, f0_length, interpolated_f0_set[0]);
  interp1(zero_crossings->positive_interval_locations,
      zero_crossings->positive_intervals,
      zero_crossings->number_of_positives,
      temporal_positions, f0_length, interpolated_f0_set[1]);
  interp1(zero_crossings->peak_interval_locations,
      zero_crossings->peak_intervals, zero_crossings->number_of_peaks,
      temporal_positions, f0_length, interpolated_f0_set[2]);
  interp1(zero_crossings->dip_interval_locations,
      zero_crossings->dip_intervals, zero_crossings->number_of_dips,
      temporal_positions, f0_length, interpolated_f0_set[3]);

  GetF0CandidateContourSub(interpolated_f0_set, f0_length, f0_floor,
      f0_ceil, boundary_f0, f0_candidate);
  for (int i = 0; i < 4; ++i) delete[] interpolated_f0_set[i];
}